

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

NESTresult * __thiscall
NEST::NESTcalc::GetYieldERdEOdxBasis
          (NESTresult *__return_storage_ptr__,NESTcalc *this,
          vector<double,_std::allocator<double>_> *dEOdxParam,string *muonInitPos,
          vector<double,_std::allocator<double>_> *vTable,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  double dVar1;
  double dVar2;
  double a;
  double dVar3;
  int iVar4;
  pointer pdVar5;
  pointer pcVar6;
  pointer pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  long lVar13;
  int *piVar14;
  NESTcalc *this_00;
  RandomGen *pRVar15;
  int64_t iVar16;
  double *pdVar17;
  runtime_error *this_01;
  undefined8 uVar18;
  int iVar19;
  int iVar20;
  NESTcalc *pNVar21;
  NESTcalc **__endptr;
  double *pdVar22;
  uint uVar23;
  VDetector *pVVar24;
  QuantaResult *pQVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  float fVar29;
  double dVar30;
  double extraout_XMM0_Qa;
  double dVar31;
  double dVar32;
  double extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  undefined1 auVar37 [16];
  double dVar38;
  string position;
  string delimiter;
  string token;
  double local_258;
  ulong uStack_250;
  double local_238;
  double dStack_230;
  double local_220;
  double local_210;
  double local_1f8;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined4 local_1a8;
  uint uStack_1a4;
  double local_188;
  double local_180;
  NESTcalc *local_178;
  int local_16c;
  NESTcalc *local_168;
  double dStack_160;
  undefined1 local_158 [24];
  double dStack_140;
  double local_138;
  undefined8 uStack_130;
  long *local_128 [2];
  long local_118 [2];
  double local_108;
  undefined8 uStack_100;
  double local_f0;
  NESTcalc *local_e8 [2];
  undefined1 local_d8 [24];
  undefined8 uStack_c0;
  QuantaResult *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  vector<double,_std::allocator<double>_> *local_90;
  double local_88;
  double dStack_80;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  long local_48;
  undefined8 uStack_40;
  
  bVar12 = this->fdetector->OldW13eV;
  this_00 = (NESTcalc *)(ulong)bVar12;
  pNVar21 = this;
  local_90 = vTable;
  WorkFunction((dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[8],this->fdetector->molarMass,bVar12);
  iVar20 = (int)pNVar21;
  pdVar5 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar5[8];
  dVar2 = this->fdetector->TopDrift;
  a = pdVar5[4];
  local_108 = pdVar5[5];
  uStack_100 = 0;
  local_f0 = pdVar5[6];
  bVar12 = ValidityTests::nearlyEqual(a,0.0,1e-09);
  if ((NAN(a)) || (bVar12)) {
LAB_001083cb:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Energy cannot be zero or undefined");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->quanta).recombProb = 0.0;
  (__return_storage_ptr__->quanta).Variance = 0.0;
  (__return_storage_ptr__->quanta).photons = 0;
  (__return_storage_ptr__->quanta).electrons = 0;
  (__return_storage_ptr__->quanta).ions = 0;
  (__return_storage_ptr__->quanta).excitons = 0;
  (__return_storage_ptr__->yields).ElectricField = 0.0;
  (__return_storage_ptr__->yields).DeltaT_Scint = 0.0;
  (__return_storage_ptr__->yields).ExcitonRatio = 0.0;
  (__return_storage_ptr__->yields).Lindhard = 0.0;
  (__return_storage_ptr__->yields).PhotonYield = 0.0;
  (__return_storage_ptr__->yields).ElectronYield = 0.0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar17 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  dVar3 = *pdVar17;
  local_d8._16_8_ = pdVar17[1];
  uStack_c0 = 0;
  dVar32 = pdVar17[2];
  bVar12 = ValidityTests::nearlyEqual(pdVar17[3],-1.0,1e-09);
  if (bVar12) {
    if ((0.0 <= a) ||
       (pdVar17 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start, 0.0 < *pdVar17 || *pdVar17 == 0.0)) {
      dVar30 = this->fdetector->radmax;
      pRVar15 = RandomGen::rndm();
      dVar38 = RandomGen::rand_uniform(pRVar15);
      if (dVar38 < 0.0) {
        dVar38 = sqrt(dVar38);
      }
      else {
        dVar38 = SQRT(dVar38);
      }
      this_00 = (NESTcalc *)RandomGen::rndm();
      dVar31 = RandomGen::rand_uniform((RandomGen *)this_00);
      dVar30 = dVar30 * dVar38;
      local_220 = cos(dVar31 * 6.283185307179586);
      local_220 = local_220 * dVar30;
      local_138 = sin(dVar31 * 6.283185307179586);
      local_138 = local_138 * dVar30;
      uStack_130 = extraout_XMM0_Qb_00;
    }
    else {
      local_220 = dVar3 + -10.0;
      local_138 = (double)local_d8._16_8_;
      uStack_130 = uStack_c0;
      dVar2 = dVar32;
    }
  }
  else {
    local_168 = (NESTcalc *)local_158;
    pcVar6 = (muonInitPos->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar6,pcVar6 + muonInitPos->_M_string_length);
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,",","");
    iVar20 = 0;
    lVar13 = std::__cxx11::string::find((char *)&local_168,(ulong)local_128[0],0);
    if (lVar13 == -1) {
      local_138 = -999.0;
      uStack_130 = 0;
      local_220 = -999.0;
    }
    else {
      local_220 = -999.0;
      local_138 = -999.0;
      uStack_130 = 0;
      do {
        std::__cxx11::string::substr((ulong)local_e8,(ulong)&local_168);
        pNVar21 = local_e8[0];
        piVar14 = __errno_location();
        bVar12 = iVar20 == 0;
        iVar20 = iVar20 + -1;
        if (bVar12) {
          iVar26 = *piVar14;
          *piVar14 = 0;
          fVar29 = strtof((char *)pNVar21,(char **)&local_178);
          if (local_178 == pNVar21) {
            std::__throw_invalid_argument("stof");
LAB_001083a7:
            std::__throw_invalid_argument("stof");
LAB_001083b3:
            std::__throw_out_of_range("stof");
LAB_001083bf:
            std::__throw_out_of_range("stof");
            goto LAB_001083cb;
          }
          if (*piVar14 == 0) {
            *piVar14 = iVar26;
          }
          else if (*piVar14 == 0x22) goto LAB_001083bf;
          local_220 = (double)fVar29;
        }
        else {
          iVar26 = *piVar14;
          *piVar14 = 0;
          fVar29 = strtof((char *)pNVar21,(char **)&local_178);
          if (local_178 == pNVar21) goto LAB_001083a7;
          if (*piVar14 == 0) {
            *piVar14 = iVar26;
          }
          else if (*piVar14 == 0x22) goto LAB_001083b3;
          local_138 = (double)fVar29;
          uStack_130 = extraout_XMM0_Qb;
        }
        std::__cxx11::string::erase((ulong)&local_168,0);
        if (local_e8[0] != (NESTcalc *)local_d8) {
          operator_delete(local_e8[0],local_d8._0_8_ + 1);
        }
        lVar13 = std::__cxx11::string::find((char *)&local_168,(ulong)local_128[0],0);
      } while (lVar13 != -1);
    }
    pNVar21 = local_168;
    piVar14 = __errno_location();
    iVar26 = *piVar14;
    *piVar14 = 0;
    __endptr = local_e8;
    fVar29 = strtof((char *)pNVar21,(char **)__endptr);
    iVar20 = (int)__endptr;
    if (local_e8[0] == pNVar21) {
      uVar18 = std::__throw_invalid_argument("stof");
      if (local_168 != (NESTcalc *)local_158) {
        operator_delete(local_168,local_158._0_8_ + 1);
      }
      pdVar5 = (__return_storage_ptr__->photon_times).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (pdVar5 != (pointer)0x0) {
        operator_delete(pdVar5,(long)(__return_storage_ptr__->photon_times).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pdVar5);
      }
      _Unwind_Resume(uVar18);
    }
    if (*piVar14 == 0) {
LAB_001076bf:
      *piVar14 = iVar26;
    }
    else if (*piVar14 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_001076bf;
    }
    if (local_128[0] != local_118) {
      uVar28 = local_118[0] + 1;
      operator_delete(local_128[0],uVar28);
      iVar20 = (int)uVar28;
    }
    this_00 = local_168;
    if (local_168 != (NESTcalc *)local_158) {
      uVar28 = local_158._0_8_ + 1;
      operator_delete(local_168,uVar28);
      iVar20 = (int)uVar28;
    }
    dVar2 = (double)fVar29;
  }
  if (dVar2 <= 0.0) {
    dVar2 = this->fdetector->TopDrift;
  }
  if (0.0 <= a) {
    local_1e8._8_8_ = 0;
    local_1e8._0_8_ =
         (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[9];
    local_258 = dVar1 * a * local_108 * 100.0;
    goto LAB_001078a1;
  }
  dVar30 = -a;
  local_1e8._8_4_ = 0;
  local_1e8._0_8_ = dVar30;
  local_1e8._12_4_ = 0x80000000;
  pdVar5 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_238 = pdVar5[10];
  if (local_238 <= 0.0) {
LAB_0010784b:
    local_238 = CalcElectronLET(this_00,dVar30,iVar20,(bool)(-(local_238 != 0.0) & 1));
  }
  else {
    dVar38 = pdVar5[0xb];
    if ((dVar38 == 0.0) && (!NAN(dVar38))) goto LAB_0010784b;
    dVar30 = pow(dVar30,dVar38);
    local_238 = local_238 * dVar30;
  }
  pRVar15 = RandomGen::rndm();
  local_258 = RandomGen::rand_zero_trunc_gauss(pRVar15,local_238,local_238);
  local_258 = dVar1 * local_108 * 100.0 * local_258;
LAB_001078a1:
  uStack_250 = 0;
  dStack_230 = local_138;
  pVVar24 = this->fdetector;
  local_238 = dVar2;
  if ((pVVar24->radmax * pVVar24->radmax <= local_220 * local_220 + local_138 * local_138) ||
     (ABS((double)local_1e8._0_8_) <= 1e-06)) {
    iVar20 = 0;
    iVar26 = 0;
    local_210 = local_220;
  }
  else {
    pQVar25 = &__return_storage_ptr__->quanta;
    local_88 = 0.0;
    if (0.0 <= dVar32) {
      local_88 = dVar32;
    }
    dVar30 = dVar3 - local_220;
    auVar33._0_8_ = local_88 - dVar2;
    auVar33._8_8_ = (double)local_d8._16_8_ - local_138;
    dVar32 = SQRT(auVar33._0_8_ * auVar33._0_8_ + dVar30 * dVar30 + auVar33._8_8_ * auVar33._8_8_);
    auVar34._8_4_ = SUB84(dVar32,0);
    auVar34._0_8_ = dVar32;
    auVar34._12_4_ = (int)((ulong)dVar32 >> 0x20);
    auVar34 = divpd(auVar33,auVar34);
    local_a0 = local_108 * 4.0 * local_108;
    local_1a8 = SUB84(a,0);
    uStack_1a4 = (uint)((ulong)a >> 0x20);
    uStack_74 = uStack_1a4 ^ 0x80000000;
    uStack_6c = 0x80000000;
    local_78 = local_1a8;
    uStack_70 = 0;
    local_58 = local_108 * auVar34._0_8_;
    dStack_50 = local_108 * auVar34._8_8_;
    iVar26 = 0;
    local_48 = -(ulong)(dVar2 <= local_88);
    uStack_40 = 0xffffffffffffffff;
    dStack_80 = 0.0;
    local_68 = -(ulong)(local_88 <= dVar2);
    uStack_60 = 0xffffffffffffffff;
    local_98 = (dVar30 / dVar32) * local_108;
    iVar20 = 0;
    local_210 = local_220;
    local_180 = 0.0;
    local_b0 = pQVar25;
    do {
      auVar35._8_8_ = -(ulong)(dStack_80 < dStack_230);
      auVar35._0_8_ = -(ulong)(local_88 < local_238);
      auVar11._8_8_ = uStack_40;
      auVar11._0_8_ = local_48;
      if (((((auVar35 | auVar11) & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
          (auVar36._8_8_ = -(ulong)(dStack_230 < dStack_80),
          auVar36._0_8_ = -(ulong)(local_238 < local_88), auVar10._8_8_ = uStack_60,
          auVar10._0_8_ = local_68,
          ((auVar36 | auVar10) & (undefined1  [16])0x1) == (undefined1  [16])0x0)) &&
         ((local_210 - dVar3) * (local_210 - dVar3) +
          (dStack_230 - (double)local_d8._16_8_) * (dStack_230 - (double)local_d8._16_8_) < local_a0
         )) break;
      dVar32 = local_f0;
      if ((local_f0 == -1.0) && (!NAN(local_f0))) {
        (*pVVar24->_vptr_VDetector[4])(local_210,SUB84(dStack_230,0),local_238);
        dVar32 = extraout_XMM0_Qa;
      }
      if (0.0 <= a) {
        (*this->_vptr_NESTcalc[10])(&local_168,this,&default_ERYieldsParam);
        (__return_storage_ptr__->yields).ElectricField = (double)local_158._16_8_;
        (__return_storage_ptr__->yields).DeltaT_Scint = dStack_140;
        (__return_storage_ptr__->yields).ExcitonRatio = (double)local_158._0_8_;
        (__return_storage_ptr__->yields).Lindhard = (double)local_158._8_8_;
        (__return_storage_ptr__->yields).PhotonYield = (double)local_168;
        (__return_storage_ptr__->yields).ElectronYield = dStack_160;
LAB_00107eab:
        (*this->_vptr_NESTcalc[0xc])
                  (dVar1,0,&local_168,this,__return_storage_ptr__,&default_NRERWidthsParam);
        pQVar25->recombProb = (double)local_158._0_8_;
        pQVar25->Variance = (double)local_158._8_8_;
        *(NESTcalc **)pQVar25 = local_168;
        *(double *)&pQVar25->ions = dStack_160;
        local_1d8._8_8_ = uStack_250;
        local_1d8._0_8_ = local_258;
      }
      else {
        dVar30 = (double)CONCAT44(uStack_74,local_78);
        auVar9._8_4_ = uStack_70;
        auVar9._0_8_ = dVar30;
        auVar9._12_4_ = uStack_6c;
        uVar28 = -(ulong)(dVar30 < local_258 + local_180);
        auVar37._0_8_ = ~uVar28 & (ulong)local_258;
        auVar37._8_8_ = ~auVar9._8_8_ & uStack_250;
        auVar8._8_4_ = uStack_70;
        auVar8._0_8_ = (ulong)(dVar30 - local_180) & uVar28;
        auVar8._12_4_ = uStack_6c;
        local_1d8 = auVar37 | auVar8;
        uStack_250 = local_1d8._8_8_;
        pdVar17 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        local_258 = local_1d8._0_8_;
        if (0.0 <= *pdVar17) {
          (*this->_vptr_NESTcalc[10])
                    (local_258,SUB84(dVar1,0),dVar32,&local_168,this,&default_ERYieldsParam);
          (__return_storage_ptr__->yields).ElectricField = (double)local_158._16_8_;
          (__return_storage_ptr__->yields).DeltaT_Scint = dStack_140;
          (__return_storage_ptr__->yields).ExcitonRatio = (double)local_158._0_8_;
          (__return_storage_ptr__->yields).Lindhard = (double)local_158._8_8_;
          (__return_storage_ptr__->yields).PhotonYield = (double)local_168;
          (__return_storage_ptr__->yields).ElectronYield = dStack_160;
          pdVar17 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          local_188 = local_258 * -*pdVar17;
          dVar38 = local_188 / (pdVar17[1] + 1.0);
          dVar30 = pdVar17[3];
          dVar31 = pow(local_258,pdVar17[4] + -1.0);
          local_1f8 = dVar31 * dVar30 * 0.25 * dVar38;
          pdVar5 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_a8 = pdVar5[1] + 1.0;
          dVar30 = log(pdVar5[2] + local_1f8);
          dVar38 = (local_a8 - dVar30 / local_1f8) * dVar38;
          pdVar17 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar30 = pdVar17[1];
          (__return_storage_ptr__->yields).PhotonYield = dVar38;
          (__return_storage_ptr__->yields).ElectronYield = local_188 - dVar38;
          (__return_storage_ptr__->yields).ExcitonRatio = dVar30;
          (__return_storage_ptr__->yields).Lindhard = 1.0;
          (__return_storage_ptr__->yields).ElectricField = dVar32;
          (__return_storage_ptr__->yields).DeltaT_Scint = -999.0;
        }
        if (0.0 < *pdVar17 || *pdVar17 == 0.0) goto LAB_00107eab;
        iVar19 = 0;
        uVar27 = 0;
        if (1.0 <= local_188) {
          pRVar15 = RandomGen::rndm();
          local_258 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                      .super__Vector_impl_data._M_start[5] * local_258;
          iVar16 = RandomGen::binom_draw(pRVar15,(long)local_258,local_188 / local_258);
          uVar27 = (uint)iVar16;
          pdVar17 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        log(pdVar17[2] + local_1f8);
        local_16c = iVar20;
        if ((0 < (int)uVar27) &&
           (1.0 < (__return_storage_ptr__->yields).PhotonYield ||
            (__return_storage_ptr__->yields).PhotonYield == 1.0)) {
          pRVar15 = RandomGen::rndm();
          iVar16 = RandomGen::binom_draw
                             (pRVar15,(ulong)uVar27,
                              (__return_storage_ptr__->yields).PhotonYield / (double)(int)uVar27);
          iVar19 = (int)iVar16;
        }
        pdVar5 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar38 = ceil((double)(int)uVar27 / (pdVar5[1] + 1.0) + -0.5);
        dVar31 = log(pdVar5[2] + local_1f8);
        dVar32 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[6];
        dVar30 = (__return_storage_ptr__->yields).PhotonYield;
        (__return_storage_ptr__->quanta).photons = iVar19;
        (__return_storage_ptr__->quanta).electrons = uVar27 - iVar19;
        (__return_storage_ptr__->quanta).ions = (int)dVar38;
        (__return_storage_ptr__->quanta).excitons = uVar27 - (int)dVar38;
        (__return_storage_ptr__->quanta).recombProb = 1.0 - dVar31 / local_1f8;
        (__return_storage_ptr__->quanta).Variance = dVar32 * dVar30;
        iVar26 = iVar26 + (uVar27 - iVar19);
        pQVar25 = local_b0;
        iVar20 = local_16c;
      }
      if (a <= 0.0) {
        iVar19 = pQVar25->photons;
        if (0.0 <= *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start) {
          iVar4 = (__return_storage_ptr__->quanta).electrons;
          pRVar15 = RandomGen::rndm();
          dVar32 = (double)(iVar4 + iVar19);
          if (dVar32 < 0.0) {
            dVar30 = sqrt(dVar32);
          }
          else {
            dVar30 = SQRT(dVar32);
          }
          dVar32 = RandomGen::rand_gauss(pRVar15,dVar32,dVar30,false);
          dVar30 = floor(dVar32 + 0.5);
          pRVar15 = RandomGen::rndm();
          iVar19 = pQVar25->photons;
          dVar32 = (double)iVar19 * 200.0;
          if (dVar32 < 0.0) {
            dVar32 = sqrt(dVar32);
          }
          else {
            dVar32 = SQRT(dVar32);
          }
          dVar32 = RandomGen::rand_gauss(pRVar15,(double)iVar19,dVar32,false);
          dVar32 = floor(dVar32 + 0.5);
          iVar19 = (int)dVar32;
          (__return_storage_ptr__->quanta).photons = iVar19;
          (__return_storage_ptr__->quanta).electrons = (int)dVar30 - iVar19;
        }
        iVar20 = iVar20 + iVar19;
      }
      else {
        iVar20 = (int)((double)iVar20 +
                      ((double)local_1d8._0_8_ / (double)local_1e8._0_8_) * (double)pQVar25->photons
                      );
      }
      dVar32 = floor(local_238 / local_108 + 0.5);
      pdVar5 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar28 = (long)pdVar7 - (long)pdVar5 >> 3;
      uVar23 = (int)uVar28 - 1;
      pNVar21 = (NESTcalc *)(ulong)uVar23;
      uVar27 = (int)dVar32;
      if (uVar28 <= (ulong)(long)(int)dVar32) {
        uVar27 = uVar23;
      }
      pdVar22 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start + 7;
      pdVar17 = pdVar5 + (int)uVar27;
      if (pdVar7 == pdVar5) {
        pdVar17 = pdVar22;
      }
      pVVar24 = this->fdetector;
      if ((pVVar24->cathode <= local_238) &&
         (0.0 <= *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start)) {
        dVar32 = (double)(__return_storage_ptr__->quanta).electrons;
        dVar30 = exp((-(pVVar24->TopDrift - local_238) / *pdVar17) / pVVar24->eLife_us);
        if (0.0 < a) {
          dVar30 = dVar30 * dVar32;
          dVar32 = (double)local_1d8._0_8_ / (double)local_1e8._0_8_;
        }
        iVar26 = (int)(dVar32 * dVar30 + (double)iVar26);
      }
      if (0.0 <= a) {
        local_258 = (double)local_1d8._0_8_;
        uStack_250 = local_1d8._8_8_;
      }
      else {
        local_1e8._0_8_ = (double)local_1e8._0_8_ - (double)local_1d8._0_8_;
        pdVar5 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_258 = pdVar5[10];
        if (local_258 <= 0.0) {
LAB_0010820e:
          local_258 = CalcElectronLET(pNVar21,(double)local_1e8._0_8_,(int)pdVar22,
                                      (bool)(-(local_258 != 0.0) & 1));
          uStack_250 = extraout_XMM0_Qb_02;
        }
        else {
          dVar32 = pdVar5[0xb];
          if ((dVar32 == 0.0) && (!NAN(dVar32))) goto LAB_0010820e;
          dVar32 = pow((double)local_1e8._0_8_,dVar32);
          local_258 = local_258 * dVar32;
          uStack_250 = 0;
          if (0.0 < (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[0xc]) {
            pRVar15 = RandomGen::rndm();
            local_258 = RandomGen::rand_gauss
                                  (pRVar15,local_258,
                                   (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[0xc] * local_258,true);
            uStack_250 = extraout_XMM0_Qb_01;
          }
        }
        local_258 = local_258 * dVar1 * local_108 * 100.0;
      }
      local_210 = local_210 + local_98;
      local_238 = local_238 + local_58;
      dStack_230 = dStack_230 + dStack_50;
      pVVar24 = this->fdetector;
      if (pVVar24->radmax * pVVar24->radmax <= local_210 * local_210 + dStack_230 * dStack_230)
      break;
      local_180 = local_180 + (double)local_1d8._0_8_;
    } while (1e-06 < ABS((double)local_1e8._0_8_));
  }
  if (iVar20 < 1) {
    iVar20 = 0;
  }
  iVar19 = 0;
  if (0 < iVar26) {
    iVar19 = iVar26;
  }
  (__return_storage_ptr__->quanta).photons = iVar20;
  (__return_storage_ptr__->quanta).electrons = iVar19;
  if ((local_f0 == -1.0) && (!NAN(local_f0))) {
    (*pVVar24->_vptr_VDetector[4])
              ((local_220 + local_210) * 0.5,SUB84((local_138 + dStack_230) * 0.5,0));
    local_f0 = extraout_XMM0_Qa_00;
  }
  (__return_storage_ptr__->yields).DeltaT_Scint = (dVar2 + local_238) * 0.5;
  (__return_storage_ptr__->yields).ElectricField = local_f0;
  return __return_storage_ptr__;
}

Assistant:

NESTresult NESTcalc::GetYieldERdEOdxBasis(
    const std::vector<double> &dEOdxParam, string muonInitPos,
    vector<double> vTable, const std::vector<double> &NRERWidthsParam) {
  Wvalue wvalue = WorkFunction(dEOdxParam[8], fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double rho = dEOdxParam[8];
  double xi = -999., yi = -999., zi = fdetector->get_TopDrift();
  double xf, yf, zf, pos_x, pos_y, pos_z, r, phi, field,
      eMin = dEOdxParam[4], z_step = dEOdxParam[5], inField = dEOdxParam[6];
  if (ValidityTests::nearlyEqual(eMin, 0.) || std::isnan(eMin))
    throw std::runtime_error("Energy cannot be zero or undefined");
  NESTresult result{};
  xf = dEOdxParam[0];
  yf = dEOdxParam[1];
  zf = dEOdxParam[2];
  if (ValidityTests::nearlyEqual(dEOdxParam[3], -1.)) {
    if (NRERWidthsParam[0] < 0. && eMin < 0.) {
      xi = xf - 10.;
      yi = yf;
      zi = zf;
    } else {
      r = fdetector->get_radmax() * sqrt(RandomGen::rndm()->rand_uniform());
      phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
      xi = r * cos(phi);
      yi = r * sin(phi);
    }
  } else {
    string position = muonInitPos;
    string delimiter = ",";
    size_t loc = 0;
    int ii = 0;
    while ((loc = position.find(delimiter)) != string::npos) {
      string token = position.substr(0, loc);
      if (ii == 0)
        xi = stof(token);
      else
        yi = stof(token);
      position.erase(0, loc + delimiter.length());
      ++ii;
    }
    zi = stof(position);
  }
  if (zi <= 0.) zi = fdetector->get_TopDrift();
  double dEOdx, eStep, refEnergy;
  if (eMin < 0.) {
    refEnergy = -eMin;
    if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
      dEOdx = dEOdxParam[10] * pow(-eMin, dEOdxParam[11]);
      if (dEOdxParam[12] > 0.)
	; //do nothing yet. Old attempts: Gaussian, Expo, Poisson
    } else
      dEOdx = CalcElectronLET(-eMin, ATOM_NUM, dEOdxParam[10]);
    eStep = rho * z_step * 1e2 * RandomGen::rndm()->rand_zero_trunc_gauss(dEOdx,dEOdx);
  } else {
    refEnergy = dEOdxParam[9];
    eStep = eMin * rho * z_step * 1e2;
  }
  double driftTime, vD, keV = 0., Nq_mean;
  int Nph = 0, Ne = 0, Nq = 0;
  double xx = xi, yy = yi, zz = zi;
  if (zf < 0.) zf = 0.;
  double distance = sqrt((xf - xi) * (xf - xi) + (yf - yi) * (yf - yi) +
                         (zf - zi) * (zf - zi));
  double norm[3];
  double xi_tib;
  norm[0] = (xf - xi) / distance;
  norm[1] = (yf - yi) / distance;
  norm[2] = (zf - zi) / distance;
  bool stopCond = false;
  while (!stopCond &&
         (xx * xx + yy * yy) <
             fdetector->get_radmax() * fdetector->get_radmax() &&
         std::abs(refEnergy) > PHE_MIN) {
    if (((zf < zi && zz <= zf) || (zf > zi && zz >= zf)) &&
        ((xx - xf) * (xx - xf) + (yy - yf) * (yy - yf)) <
            4. * z_step * z_step) {
      stopCond = true;
      break;
    }
    // stop making S1 and S2 if particle exits Xe volume, OR runs out of
    // energy (in case of beta)
    if (inField == -1.)
      field = fdetector->FitEF(xx, yy, zz);
    else
      field = inField;
    if (eMin < 0.) {
      if ((keV + eStep) > -eMin) eStep = -eMin - keV;
      if (NRERWidthsParam[0] < 0.) {
        YieldResult yields{};
        Nq_mean = -NRERWidthsParam[0] * eStep;
        double Ni_mean = Nq_mean / (1. + NRERWidthsParam[1]);
        xi_tib = Ni_mean * (NRERWidthsParam[3] / 4.) *
                 pow(eStep, NRERWidthsParam[4] - 1.);
        yields.PhotonYield =
            Ni_mean * (1. + NRERWidthsParam[1] -
                       log(NRERWidthsParam[2] + xi_tib) / xi_tib);
        yields.ElectronYield = Nq_mean - yields.PhotonYield;
        yields.ExcitonRatio = NRERWidthsParam[1];
        yields.Lindhard = 1.;
        yields.ElectricField = field;
        yields.DeltaT_Scint = -999;
        result.yields = yields;
      } else
        result.yields = GetYieldBetaGR(eStep, rho, field);
    } else {
      result.yields = GetYieldBetaGR(refEnergy, rho, field);
    }
    if (eMin < 0. && NRERWidthsParam[0] < 0.) {
      QuantaResult quanta{};
      if (Nq_mean < 1.)
        Nq = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(Nq_mean,sqrt(NRERWidthsParam[5]*Nq_mean),true)-0.5))
        Nq = RandomGen::rndm()->binom_draw(NRERWidthsParam[5]*eStep,Nq_mean/(NRERWidthsParam[5]*eStep));
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      if (result.yields.PhotonYield < 1. || Nq <= 0)
        quanta.photons = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(result.yields.PhotonYield,sqrt(NRERWidthsParam[6]*result.yields.PhotonYield),true)-0.5))
        quanta.photons = RandomGen::rndm()->binom_draw(Nq,result.yields.PhotonYield/double(Nq));
      quanta.electrons = Nq - quanta.photons;
      quanta.ions = int(ceil(double(Nq) / (1. + NRERWidthsParam[1]) - 0.5));
      quanta.excitons = Nq - quanta.ions;
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      quanta.Variance = NRERWidthsParam[6] * result.yields.PhotonYield;
      result.quanta = quanta;
      Ne += result.quanta.electrons;
    } else
      result.quanta =
          GetQuanta(result.yields, rho, default_NRERWidthsParam, -999.);
    if (eMin > 0.)
      Nph += result.quanta.photons * (eStep / refEnergy);
    else {
      if (NRERWidthsParam[0] >= 0.) {
        Nq = result.quanta.photons + result.quanta.electrons;
        double FanoOverall =
            1.;  // use 6 for ~0.7% energy resolution at 2.6 MeV and 190 V/cm
        double FanoScint =
            200.;  // standin for recombination fluctuations in this approach
        Nq = int(floor(
            RandomGen::rndm()->rand_gauss(Nq, sqrt(FanoOverall * Nq), false) +
            0.5));
        result.quanta.photons =
            int(floor(RandomGen::rndm()->rand_gauss(
                          result.quanta.photons,
                          sqrt(FanoScint * result.quanta.photons), false) +
                      0.5));
        result.quanta.electrons = Nq - result.quanta.photons;
      }
      Nph += result.quanta.photons;
    }
    int index = int(floor(zz / z_step + 0.5));
    if (index >= vTable.size()) index = vTable.size() - 1;
    if (vTable.size() == 0)
      vD = dEOdxParam[7];
    else
      vD = vTable[index];
    driftTime = (fdetector->get_TopDrift() - zz) / vD;
    if (zz >= fdetector->get_cathode() && NRERWidthsParam[0] >= 0.) {
      if (eMin > 0.)
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us()) * (eStep / refEnergy);
      else
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us());
    }
    keV += eStep;
    xx += norm[0] * z_step;
    yy += norm[1] * z_step;
    zz += norm[2] * z_step;
    if (eMin < 0.) {
      refEnergy -= eStep;
      if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
        dEOdx = dEOdxParam[10] * pow(refEnergy, dEOdxParam[11]);
        if (dEOdxParam[12] > 0.)
          dEOdx = RandomGen::rndm()->rand_gauss(dEOdx, dEOdxParam[12] * dEOdx,
                                                true);
      } else
        dEOdx = CalcElectronLET(refEnergy, ATOM_NUM, dEOdxParam[10]);
      eStep = dEOdx * rho * z_step * 1e2;
    }
    // cerr << keV << "\t\t" << xx << "\t" << yy << "\t" << zz << "\t" << Nph <<
    // "\t" << Ne << endl;
  }
  if (Nph < 0) Nph = 0;
  if (Ne < 0) Ne = 0;
  result.quanta.photons = Nph;
  result.quanta.electrons = Ne;
  pos_x =
      0.5 * (xi + xx);  // approximate things not already done right in loop as
  // middle of detector since muon traverses whole length
  pos_y = 0.5 * (yi + yy);
  pos_z = 0.5 * (zi + zz);
  if (inField == -1.)
    field = fdetector->FitEF(pos_x, pos_y, pos_z);
  else
    field = inField;
  result.yields.DeltaT_Scint = pos_z;
  result.yields.ElectricField = field;
  return result;
}